

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

int Cec_ManSatSolveExractPattern(Vec_Int_t *vCexStore,int iStart,Vec_Int_t *vPat)

{
  int iVar1;
  int Entry;
  undefined4 local_2c;
  int nSize;
  int k;
  Vec_Int_t *vPat_local;
  int iStart_local;
  Vec_Int_t *vCexStore_local;
  
  Vec_IntClear(vPat);
  vCexStore_local._4_4_ = iStart + 2;
  iVar1 = Vec_IntEntry(vCexStore,iStart + 1);
  if (0 < iVar1) {
    vPat_local._4_4_ = vCexStore_local._4_4_;
    for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
      Entry = Vec_IntEntry(vCexStore,vPat_local._4_4_);
      Vec_IntPush(vPat,Entry);
      vPat_local._4_4_ = vPat_local._4_4_ + 1;
    }
    vCexStore_local._4_4_ = vPat_local._4_4_;
  }
  return vCexStore_local._4_4_;
}

Assistant:

int Cec_ManSatSolveExractPattern( Vec_Int_t * vCexStore, int iStart, Vec_Int_t * vPat )
{
    int k, nSize;
    Vec_IntClear( vPat );
    // skip the output number
    iStart++;
    // get the number of items
    nSize = Vec_IntEntry( vCexStore, iStart++ );
    if ( nSize <= 0 )
        return iStart;
    // extract pattern
    for ( k = 0; k < nSize; k++ )
        Vec_IntPush( vPat, Vec_IntEntry( vCexStore, iStart++ ) );
    return iStart;
}